

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O2

void __thiscall
FThinkerIterator::FThinkerIterator(FThinkerIterator *this,PClass *type,int statnum,DThinker *prev)

{
  BYTE BVar1;
  DThinker *pDVar2;
  
  BVar1 = ' ';
  if ((uint)statnum < 0x80) {
    BVar1 = (BYTE)statnum;
  }
  this->m_Stat = BVar1;
  this->m_SearchStats = 0x7f < (uint)statnum;
  this->m_ParentType = type;
  if ((prev != (DThinker *)0x0) && (((prev->NextThinker->super_DObject).ObjectFlags & 0x400) == 0))
  {
    this->m_CurrThinker = prev->NextThinker;
    this->m_SearchingFresh = false;
    return;
  }
  pDVar2 = FThinkerList::GetHead(DThinker::Thinkers + this->m_Stat);
  this->m_CurrThinker = pDVar2;
  this->m_SearchingFresh = false;
  return;
}

Assistant:

FThinkerIterator::FThinkerIterator (const PClass *type, int statnum, DThinker *prev)
{
	if ((unsigned)statnum > MAX_STATNUM)
	{
		m_Stat = STAT_FIRST_THINKING;
		m_SearchStats = true;
	}
	else
	{
		m_Stat = statnum;
		m_SearchStats = false;
	}
	m_ParentType = type;
	if (prev == NULL || (prev->NextThinker->ObjectFlags & OF_Sentinel))
	{
		Reinit();
	}
	else
	{
		m_CurrThinker = prev->NextThinker;
		m_SearchingFresh = false;
	}
}